

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O3

TileCoord __thiscall Imf_2_5::DeepTiledOutputFile::Data::nextTileCoord(Data *this,TileCoord *a)

{
  LineOrder LVar1;
  LevelMode LVar2;
  ArgExc *this_00;
  LogicExc *this_01;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong in_RDX;
  uint uVar6;
  TileCoord *pTVar7;
  ulong uVar8;
  TileCoord TVar9;
  stringstream _iex_throw_s;
  stringstream local_190 [16];
  ostream local_180 [376];
  
  uVar4 = (ulong)a >> 0x20;
  LVar1 = this->lineOrder;
  iVar5 = (int)in_RDX;
  iVar3 = (int)((ulong)a >> 0x20);
  if (LVar1 == INCREASING_Y) {
    uVar6 = (int)a + 1;
    pTVar7 = (TileCoord *)(ulong)uVar6;
    if (this->numXTiles[iVar5] <= (int)uVar6) {
      uVar4 = (ulong)(iVar3 + 1U);
      pTVar7 = (TileCoord *)0x0;
      if (this->numYTiles[(long)in_RDX >> 0x20] <= (int)(iVar3 + 1U)) {
        LVar2 = (this->tileDesc).mode;
        pTVar7 = (TileCoord *)0x0;
        if (LVar2 < RIPMAP_LEVELS) {
          in_RDX = (in_RDX & 0xffffffff00000000 | (ulong)(iVar5 + 1)) + 0x100000000;
        }
        else {
          if (LVar2 != RIPMAP_LEVELS) {
            uVar4 = 0;
            if (LVar2 == NUM_LEVELMODES) {
LAB_00205a94:
              this_01 = (LogicExc *)__cxa_allocate_exception(0x48);
              Iex_2_5::LogicExc::LogicExc(this_01,"unknown level mode computing nextTileCoord");
              __cxa_throw(this_01,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
            }
            goto LAB_00205b8f;
          }
          uVar4 = in_RDX + 1;
          uVar8 = in_RDX & 0xffffffff00000000;
          in_RDX = uVar8 + 0x100000000;
          if ((int)uVar4 < this->numXLevels) {
            in_RDX = uVar4 & 0xffffffff | uVar8;
          }
        }
        uVar4 = 0;
      }
    }
  }
  else if (LVar1 == DECREASING_Y) {
    uVar6 = (int)a + 1;
    pTVar7 = (TileCoord *)(ulong)uVar6;
    if (this->numXTiles[iVar5] <= (int)uVar6) {
      pTVar7 = (TileCoord *)0x0;
      if (iVar3 == 0 || (long)a < 0) {
        LVar2 = (this->tileDesc).mode;
        if (LVar2 < RIPMAP_LEVELS) {
          in_RDX = (in_RDX & 0xffffffff00000000 | (ulong)(iVar5 + 1)) + 0x100000000;
        }
        else if (LVar2 == RIPMAP_LEVELS) {
          uVar4 = in_RDX + 1;
          uVar8 = in_RDX & 0xffffffff00000000;
          in_RDX = uVar8 + 0x100000000;
          if ((int)uVar4 < this->numXLevels) {
            in_RDX = uVar4 & 0xffffffff | uVar8;
          }
        }
        else if (LVar2 == NUM_LEVELMODES) goto LAB_00205a94;
        if ((int)(in_RDX >> 0x20) < this->numYLevels) {
          uVar4 = (ulong)(this->numYTiles[(long)in_RDX >> 0x20] - 1);
          goto LAB_00205b8f;
        }
      }
      uVar4 = (ulong)(iVar3 - 1);
    }
  }
  else {
    pTVar7 = a;
    if (LVar1 == RANDOM_Y) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_180,
                 "can\'t compute next tile from randomly ordered image: use getTilesInOrder instead"
                 ,0x50);
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)local_190);
      __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
  }
LAB_00205b8f:
  TVar9._0_8_ = (ulong)pTVar7 & 0xffffffff | uVar4 << 0x20;
  TVar9.lx = (int)in_RDX;
  TVar9.ly = (int)(in_RDX >> 0x20);
  return TVar9;
}

Assistant:

TileCoord
DeepTiledOutputFile::Data::nextTileCoord (const TileCoord &a)
{
    TileCoord b = a;

    if (lineOrder == INCREASING_Y)
    {
        b.dx++;

        if (b.dx >= numXTiles[b.lx])
        {
            b.dx = 0;
            b.dy++;

            if (b.dy >= numYTiles[b.ly])
            {
                //
                // the next tile is in the next level
                //

                b.dy = 0;

                switch (tileDesc.mode)
                {
                  case ONE_LEVEL:
                  case MIPMAP_LEVELS:

                    b.lx++;
                    b.ly++;
                    break;

                  case RIPMAP_LEVELS:

                    b.lx++;

                    if (b.lx >= numXLevels)
                    {
                        b.lx = 0;
                        b.ly++;

                        #ifdef DEBUG
                            assert (b.ly <= numYLevels);
                        #endif
                    }
                    break;
                  case NUM_LEVELMODES :
                      throw IEX_NAMESPACE::LogicExc("unknown level mode computing nextTileCoord");
                }
            }
        }
    }
    else if (lineOrder == DECREASING_Y)
    {
        b.dx++;

        if (b.dx >= numXTiles[b.lx])
        {
            b.dx = 0;
            b.dy--;

            if (b.dy < 0)
            {
                //
                // the next tile is in the next level
                //

                switch (tileDesc.mode)
                {
                  case ONE_LEVEL:
                  case MIPMAP_LEVELS:

                    b.lx++;
                    b.ly++;
                    break;

                  case RIPMAP_LEVELS:

                    b.lx++;

                    if (b.lx >= numXLevels)
                    {
                        b.lx = 0;
                        b.ly++;

                        #ifdef DEBUG
                            assert (b.ly <= numYLevels);
                        #endif
                    }
                    break;
                  case NUM_LEVELMODES :
                      throw IEX_NAMESPACE::LogicExc("unknown level mode computing nextTileCoord");
                }

                if (b.ly < numYLevels)
                    b.dy = numYTiles[b.ly] - 1;
            }
        }
    }else if(lineOrder==RANDOM_Y)
    {                 
        THROW (IEX_NAMESPACE::ArgExc,
              "can't compute next tile from randomly ordered image: use getTilesInOrder instead");
        
    }

    return b;
}